

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingScanPartial<signed_char,signed_char,unsigned_char>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  BitpackingMode BVar1;
  byte bVar2;
  char cVar3;
  data_ptr_t pdVar4;
  idx_t iVar5;
  BitpackingScanState<signed_char,_signed_char> *this;
  ulong uVar6;
  uint uVar7;
  size_t sVar9;
  long lVar10;
  idx_t iVar11;
  data_ptr_t data;
  uint8_t *in;
  ulong __n;
  ulong uVar8;
  
  this = (BitpackingScanState<signed_char,_signed_char> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar4 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (scan_count != 0) {
    iVar11 = 0;
    do {
      if (this->current_group_offset == 0x800) {
        BitpackingScanState<signed_char,_signed_char>::LoadNextGroup(this);
      }
      iVar5 = this->current_group_offset;
      BVar1 = (this->current_group).mode;
      uVar6 = scan_count - iVar11;
      if (BVar1 == CONSTANT_DELTA) {
        __n = 0x800 - iVar5;
        if (uVar6 < 0x800 - iVar5) {
          __n = uVar6;
        }
        if (__n != 0) {
          uVar6 = 0;
          do {
            pdVar4[uVar6 + iVar11 + result_offset] =
                 this->current_constant * ((char)(int)this->current_group_offset + (char)uVar6) +
                 this->current_frame_of_reference;
            uVar6 = uVar6 + 1;
          } while (__n != uVar6);
        }
      }
      else if (BVar1 == CONSTANT) {
        __n = 0x800 - iVar5;
        if (uVar6 < 0x800 - iVar5) {
          __n = uVar6;
        }
        if (scan_count - iVar11 != 0) {
          switchD_0105b559::default
                    (pdVar4 + iVar11 + result_offset,(uint)(byte)this->current_constant,
                     scan_count - iVar11);
        }
      }
      else {
        uVar7 = (uint)iVar5 & 0x1f;
        uVar8 = (ulong)uVar7;
        __n = 0x20 - uVar8;
        if (uVar6 < 0x20 - uVar8) {
          __n = uVar6;
        }
        bVar2 = this->current_width;
        uVar6 = (ulong)bVar2;
        in = this->current_group_ptr + ((iVar5 * uVar6 >> 3) - (ulong)(uVar7 * bVar2 >> 3));
        data = pdVar4 + iVar11 + result_offset;
        if ((__n == 0x20) && (uVar8 == 0)) {
          lVar10 = 0;
          do {
            duckdb_fastpforlib::internal::fastunpack_quarter(in,data + lVar10,(uint)bVar2);
            lVar10 = lVar10 + 8;
            in = in + uVar6;
          } while (lVar10 != 0x20);
        }
        else {
          lVar10 = 0;
          do {
            duckdb_fastpforlib::internal::fastunpack_quarter
                      (in,(uint8_t *)(this->decompression_buffer + lVar10),(uint)bVar2);
            lVar10 = lVar10 + 8;
            in = in + uVar6;
          } while (lVar10 != 0x20);
          switchD_015ff80e::default(data,this->decompression_buffer + uVar8,__n);
        }
        if ((this->current_group).mode == DELTA_FOR) {
          cVar3 = this->current_frame_of_reference;
          if (cVar3 != '\0' && scan_count != iVar11) {
            sVar9 = 0;
            do {
              data[sVar9] = data[sVar9] + cVar3;
              sVar9 = sVar9 + 1;
            } while (__n != sVar9);
          }
          DeltaDecode<signed_char>((char *)data,this->current_delta_offset,__n);
          this->current_delta_offset = data[__n - 1];
        }
        else {
          cVar3 = this->current_frame_of_reference;
          if (cVar3 != '\0' && scan_count != iVar11) {
            sVar9 = 0;
            do {
              data[sVar9] = data[sVar9] + cVar3;
              sVar9 = sVar9 + 1;
            } while (__n != sVar9);
          }
        }
      }
      this->current_group_offset = this->current_group_offset + __n;
      iVar11 = iVar11 + __n;
    } while (iVar11 < scan_count);
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}